

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.cpp
# Opt level: O2

ConstantFoldingRule *
spvtools::opt::anon_unknown_0::FoldBinaryOp
          (ConstantFoldingRule *__return_storage_ptr__,BinaryScalarFoldingRule *scalar_rule)

{
  undefined8 *puVar1;
  _Any_data local_30;
  long local_20;
  undefined8 local_18;
  
  std::
  function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
  ::function((function<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
              *)&local_30,scalar_rule);
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  puVar1 = (undefined8 *)operator_new(0x20);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = local_18;
  if (local_20 != 0) {
    *puVar1 = local_30._M_unused._M_object;
    puVar1[1] = local_30._8_8_;
    puVar1[2] = local_20;
  }
  *(undefined8 **)&(__return_storage_ptr__->super__Function_base)._M_functor = puVar1;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/const_folding_rules.cpp:726:10)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/const_folding_rules.cpp:726:10)>
       ::_M_manager;
  return __return_storage_ptr__;
}

Assistant:

ConstantFoldingRule FoldBinaryOp(BinaryScalarFoldingRule scalar_rule) {
  return [scalar_rule](IRContext* context, Instruction* inst,
                       const std::vector<const analysis::Constant*>& constants)
             -> const analysis::Constant* {
    assert(constants.size() == inst->NumInOperands());
    assert(constants.size() == (inst->opcode() == spv::Op::OpExtInst ? 3 : 2));
    analysis::ConstantManager* const_mgr = context->get_constant_mgr();
    analysis::TypeManager* type_mgr = context->get_type_mgr();
    const analysis::Type* result_type = type_mgr->GetType(inst->type_id());
    const analysis::Vector* vector_type = result_type->AsVector();

    const analysis::Constant* arg1 =
        (inst->opcode() == spv::Op::OpExtInst) ? constants[1] : constants[0];
    const analysis::Constant* arg2 =
        (inst->opcode() == spv::Op::OpExtInst) ? constants[2] : constants[1];

    if (arg1 == nullptr || arg2 == nullptr) {
      return nullptr;
    }

    if (vector_type == nullptr) {
      return scalar_rule(result_type, arg1, arg2, const_mgr);
    }

    std::vector<const analysis::Constant*> a_components;
    std::vector<const analysis::Constant*> b_components;
    std::vector<const analysis::Constant*> results_components;

    a_components = arg1->GetVectorComponents(const_mgr);
    b_components = arg2->GetVectorComponents(const_mgr);
    assert(a_components.size() == b_components.size());

    // Fold each component of the vector.
    for (uint32_t i = 0; i < a_components.size(); ++i) {
      results_components.push_back(scalar_rule(vector_type->element_type(),
                                               a_components[i], b_components[i],
                                               const_mgr));
      if (results_components[i] == nullptr) {
        return nullptr;
      }
    }

    // Build the constant object and return it.
    std::vector<uint32_t> ids;
    for (const analysis::Constant* member : results_components) {
      ids.push_back(const_mgr->GetDefiningInstruction(member)->result_id());
    }
    return const_mgr->GetConstant(vector_type, ids);
  };
}